

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

Vec_Ptr_t ** findTopologicalOrder(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t **ppVVar2;
  Vec_Ptr_t *pVVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pNode;
  int local_30;
  int local_2c;
  int k;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj;
  Vec_Ptr_t **vNodes;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkPiNum(pNtk);
  ppVVar2 = (Vec_Ptr_t **)malloc((long)iVar1 << 3);
  for (local_2c = 0; iVar1 = Abc_NtkPiNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
    pVVar3 = Vec_PtrAlloc(0x32);
    ppVVar2[local_2c] = pVVar3;
  }
  for (local_2c = 0; iVar1 = Abc_NtkCiNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar4 = Abc_NtkCi(pNtk,local_2c);
    Abc_NtkIncrementTravId(pNtk);
    Abc_NodeSetTravIdCurrent(pAVar4);
    pAVar4 = Abc_ObjFanout0Ntk(pAVar4);
    for (local_30 = 0; iVar1 = Abc_ObjFanoutNum(pAVar4), local_30 < iVar1; local_30 = local_30 + 1)
    {
      pNode = Abc_ObjFanout(pAVar4,local_30);
      Abc_NtkDfsReverse_rec(pNode,ppVVar2[local_2c]);
    }
  }
  return ppVVar2;
}

Assistant:

static Vec_Ptr_t ** 
findTopologicalOrder( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t ** vNodes;
    Abc_Obj_t * pObj, * pFanout;
    int i, k;    
    
    extern void Abc_NtkDfsReverse_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes );
    
    /* start the array of nodes */
    vNodes = ABC_ALLOC(Vec_Ptr_t *, Abc_NtkPiNum(pNtk));
    for(i = 0; i < Abc_NtkPiNum(pNtk); i++)
        vNodes[i] = Vec_PtrAlloc(50);   
    
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        /* set the traversal ID */
        Abc_NtkIncrementTravId( pNtk );
        Abc_NodeSetTravIdCurrent( pObj );
        pObj = Abc_ObjFanout0Ntk(pObj);
        Abc_ObjForEachFanout( pObj, pFanout, k )
            Abc_NtkDfsReverse_rec( pFanout, vNodes[i] );
    }
   
    return vNodes;
}